

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

iterator * __thiscall
google::
sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::find<int>(iterator *__return_storage_ptr__,
           sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *this,int *key)

{
  pair<unsigned_long,_unsigned_long> pVar1;
  nonempty_iterator local_68;
  nonempty_iterator local_48;
  
  if ((this->table).settings.num_buckets != this->num_deleted) {
    pVar1 = find_position<int>(this,key);
    if (pVar1.first != 0xffffffffffffffff) {
      sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
      get_iter(&local_48,&this->table,pVar1.first);
      sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
      nonempty_end(&local_68,&this->table);
      (__return_storage_ptr__->end).row_current._M_current = local_68.row_current._M_current;
      (__return_storage_ptr__->end).col_current = local_68.col_current;
      (__return_storage_ptr__->end).row_begin._M_current = local_68.row_begin._M_current;
      (__return_storage_ptr__->end).row_end._M_current = local_68.row_end._M_current;
      (__return_storage_ptr__->pos).row_begin._M_current = local_48.row_begin._M_current;
      (__return_storage_ptr__->pos).row_end._M_current = local_48.row_end._M_current;
      (__return_storage_ptr__->pos).row_current._M_current = local_48.row_current._M_current;
      (__return_storage_ptr__->pos).col_current = local_48.col_current;
      __return_storage_ptr__->ht = this;
      sparse_hashtable_iterator<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::advance_past_deleted(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  end(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

iterator find(const K& key) {
    if (size() == 0) return end();
    std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first == ILLEGAL_BUCKET)  // alas, not there
      return end();
    else
      return iterator(this, table.get_iter(pos.first), table.nonempty_end());
  }